

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_si_iec_units.cpp
# Opt level: O0

bool tlx::parse_si_iec_units(char *str,uint64_t *out_size,char default_unit)

{
  ulong uVar1;
  uint local_3c;
  uint local_38;
  uint p;
  uint power;
  uint base;
  char *endptr;
  uint64_t *puStack_20;
  char default_unit_local;
  uint64_t *out_size_local;
  char *str_local;
  
  endptr._7_1_ = default_unit;
  puStack_20 = out_size;
  out_size_local = (uint64_t *)str;
  uVar1 = strtoul(str,(char **)&power,10);
  *puStack_20 = uVar1;
  if (_power == (char *)0x0) {
    str_local._7_1_ = false;
  }
  else {
    for (; *_power == ' '; _power = _power + 1) {
    }
    p = 1000;
    local_38 = 0;
    if ((*_power == 'k') || (*_power == 'K')) {
      local_38 = 1;
      _power = _power + 1;
    }
    else if ((*_power == 'm') || (*_power == 'M')) {
      local_38 = 2;
      _power = _power + 1;
    }
    else if ((*_power == 'g') || (*_power == 'G')) {
      local_38 = 3;
      _power = _power + 1;
    }
    else if ((*_power == 't') || (*_power == 'T')) {
      local_38 = 4;
      _power = _power + 1;
    }
    else if ((*_power == 'p') || (*_power == 'P')) {
      local_38 = 5;
      _power = _power + 1;
    }
    if (((*_power == 'i') || (*_power == 'I')) && (local_38 != 0)) {
      p = 0x400;
      _power = _power + 1;
    }
    if ((*_power == 'b') || (*_power == 'B')) {
      _power = _power + 1;
    }
    else if (local_38 == 0) {
      switch(endptr._7_1_) {
      case 'G':
        local_38 = 3;
        p = 0x400;
        break;
      default:
        break;
      case 'K':
        local_38 = 1;
        p = 0x400;
        break;
      case 'M':
        local_38 = 2;
        p = 0x400;
        break;
      case 'P':
        local_38 = 5;
        p = 0x400;
        break;
      case 'T':
        local_38 = 4;
        p = 0x400;
        break;
      case 'g':
        local_38 = 3;
        p = 1000;
        break;
      case 'k':
        local_38 = 1;
        p = 1000;
        break;
      case 'm':
        local_38 = 2;
        p = 1000;
        break;
      case 'p':
        local_38 = 5;
        p = 1000;
        break;
      case 't':
        local_38 = 4;
        p = 1000;
      }
    }
    for (; *_power == ' '; _power = _power + 1) {
    }
    for (local_3c = 0; local_3c < local_38; local_3c = local_3c + 1) {
      *puStack_20 = (ulong)p * *puStack_20;
    }
    str_local._7_1_ = *_power == '\0';
  }
  return str_local._7_1_;
}

Assistant:

bool parse_si_iec_units(
    const char* str, uint64_t* out_size, char default_unit) {

    char* endptr;
    *out_size = strtoul(str, &endptr, 10);
    if (endptr == nullptr) return false;        // parse failed, no number

    while (*endptr == ' ') ++endptr;            // skip over spaces

    // multiply with base ^ power
    unsigned int base = 1000;
    unsigned int power = 0;

    if (*endptr == 'k' || *endptr == 'K')
        power = 1, ++endptr;
    else if (*endptr == 'm' || *endptr == 'M')
        power = 2, ++endptr;
    else if (*endptr == 'g' || *endptr == 'G')
        power = 3, ++endptr;
    else if (*endptr == 't' || *endptr == 'T')
        power = 4, ++endptr;
    else if (*endptr == 'p' || *endptr == 'P')
        power = 5, ++endptr;

    // switch to power of two (only if power was set above)
    if ((*endptr == 'i' || *endptr == 'I') && power != 0)
        base = 1024, ++endptr;

    // byte indicator
    if (*endptr == 'b' || *endptr == 'B') {
        ++endptr;
    }
    else if (power == 0)
    {
        // no explicit power indicator, and no 'b' or 'B' -> apply default unit
        switch (default_unit)
        {
        default: break;
        case 'k': power = 1, base = 1000;
            break;
        case 'm': power = 2, base = 1000;
            break;
        case 'g': power = 3, base = 1000;
            break;
        case 't': power = 4, base = 1000;
            break;
        case 'p': power = 5, base = 1000;
            break;
        case 'K': power = 1, base = 1024;
            break;
        case 'M': power = 2, base = 1024;
            break;
        case 'G': power = 3, base = 1024;
            break;
        case 'T': power = 4, base = 1024;
            break;
        case 'P': power = 5, base = 1024;
            break;
        }
    }

    // skip over spaces
    while (*endptr == ' ') ++endptr;

    // multiply size
    for (unsigned int p = 0; p < power; ++p)
        *out_size *= base;

    return (*endptr == 0);
}